

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

bool readFromFile<float,short>
               (string *fname,TWaveformT<short> *res,TTrainKeys *trainKeys,
               int32_t *bufferSize_frames)

{
  int iVar1;
  iterator __position;
  uint uVar2;
  int offset;
  TKey keyPressed;
  ifstream fin;
  int local_244;
  TWaveformT<short> *local_240;
  long local_238 [4];
  byte abStack_218 [488];
  
  if (*(long *)(trainKeys + 8) != *(long *)trainKeys) {
    *(long *)(trainKeys + 8) = *(long *)trainKeys;
  }
  local_240 = res;
  std::ifstream::ifstream(local_238,(string *)fname,_S_bin);
  if (*(int *)(abStack_218 + *(long *)(local_238[0] + -0x18)) == 0) {
    *bufferSize_frames = 1;
    std::istream::read((char *)local_238,(long)bufferSize_frames);
    iVar1 = *bufferSize_frames;
    offset = 0;
    do {
      local_244 = 0;
      std::istream::read((char *)local_238,(long)&local_244);
      uVar2 = 3;
      if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 2) == 0) {
        __position._M_current = *(int **)(trainKeys + 8);
        if (__position._M_current == *(int **)(trainKeys + 0x10)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)trainKeys,__position,&local_244);
        }
        else {
          *__position._M_current = local_244;
          *(int **)(trainKeys + 8) = __position._M_current + 1;
        }
        (anonymous_namespace)::readWaveform<float,short>
                  ((ifstream *)local_238,local_240,offset,(long)iVar1 << 0xb);
        offset = offset + iVar1 * 0x200;
        uVar2 = (*(int *)(abStack_218 + *(long *)(local_238[0] + -0x18)) << 0x1e) >> 0x1f & 3;
      }
    } while (uVar2 == 0);
    if (uVar2 == 3) {
      trainKeys = (TTrainKeys *)0x1;
      std::ifstream::close();
    }
  }
  else {
    trainKeys = (TTrainKeys *)0x0;
  }
  std::ifstream::~ifstream(local_238);
  return (bool)((byte)trainKeys & 1);
}

Assistant:

bool readFromFile(const std::string & fname, TWaveformT<TSample> & res, TTrainKeys & trainKeys, int32_t & bufferSize_frames) {
    trainKeys.clear();

    std::ifstream fin(fname, std::ios::binary);
    if (fin.good() == false) {
        return false;
    }

    bufferSize_frames = 1;
    fin.read((char *)(&bufferSize_frames), sizeof(bufferSize_frames));

    {
        static_assert(std::is_same<TSampleInput, TSampleF>::value, "TSampleInput not supported");
        static_assert(std::is_same<TSample, TSampleF>::value ||
                      std::is_same<TSample, TSampleI16>::value, "TSample not supported");

        int32_t offset = 0;
        std::streamsize size = bufferSize_frames*kSamplesPerFrame*sizeof(TSampleInput);
        while (true) {
            TKey keyPressed = 0;
            fin.read((char *)(&keyPressed), sizeof(keyPressed));
            if (fin.eof()) break;
            trainKeys.push_back(keyPressed);

            if (readWaveform<TSampleInput>(fin, res, offset, size) == false) {
                return false;
            }

            offset += size/sizeof(TSampleInput);
            if (fin.eof()) break;
        }
    }

    fin.close();

    return true;
}